

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  zip_t *pzVar5;
  ssize_t sVar6;
  FILE *__s;
  unsigned_long_long uVar7;
  char *pcVar8;
  undefined8 uVar9;
  char *pcVar10;
  
  minunit_setup = test_setup;
  minunit_teardown = test_teardown;
  if ((((minunit_real_timer != 0.0) || (NAN(minunit_real_timer))) || (minunit_proc_timer != 0.0)) ||
     (NAN(minunit_proc_timer))) {
LAB_001024a5:
    builtin_strncpy(ZIPNAME,"z-XXXXXX",9);
    ZIPNAME[9] = '\0';
    ZIPNAME[10] = '\0';
    ZIPNAME[0xb] = '\0';
    ZIPNAME[0xc] = '\0';
    ZIPNAME[0xd] = '\0';
    ZIPNAME[0xe] = '\0';
    ZIPNAME[0xf] = '\0';
    ZIPNAME[0x10] = '\0';
    ZIPNAME[0x11] = '\0';
    ZIPNAME[0x12] = '\0';
    ZIPNAME[0x13] = '\0';
    builtin_strncpy(WFILE,"w-XXXXXX",9);
    WFILE[9] = '\0';
    WFILE[10] = '\0';
    WFILE[0xb] = '\0';
    WFILE[0xc] = '\0';
    WFILE[0xd] = '\0';
    WFILE[0xe] = '\0';
    WFILE[0xf] = '\0';
    WFILE[0x10] = '\0';
    WFILE[0x11] = '\0';
    WFILE[0x12] = '\0';
    WFILE[0x13] = '\0';
    mkstemp(ZIPNAME);
    mkstemp(WFILE);
  }
  else {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
    if (minunit_setup != (_func_void *)0x0) goto LAB_001024a5;
  }
  minunit_status = '\0';
  pzVar5 = zip_open(ZIPNAME,6,'w');
  minunit_assert = minunit_assert + 1;
  if (pzVar5 == (zip_t *)0x0) {
    pcVar10 = "zip != NULL";
    uVar9 = 0x27;
LAB_0010259b:
    pcVar8 = "%s failed:\n\t%s:%d: %s";
    goto LAB_001026a3;
  }
  putchar(0x2e);
  minunit_assert = minunit_assert + 1;
  iVar3 = zip_entry_open(pzVar5,"test/test-1.txt");
  if (iVar3 == 0) {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar3 = zip_entry_write(pzVar5,"Some test data 1...",0x13);
    if (iVar3 != 0) {
      uVar9 = 0x2a;
      goto LAB_0010269d;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    pcVar10 = zip_entry_name(pzVar5);
    iVar3 = strcmp(pcVar10,"test/test-1.txt");
    if (iVar3 != 0) {
      uVar9 = 0x2b;
      goto LAB_0010269d;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    sVar6 = zip_entry_index(pzVar5);
    if ((int)sVar6 != 0) {
      uVar9 = 0x2c;
      goto LAB_0010269d;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    uVar7 = zip_entry_size(pzVar5);
    if ((int)uVar7 != 0x13) {
      pcVar8 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uVar9 = 0x2d;
      pcVar10 = (char *)0x13;
      goto LAB_001026a3;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    uVar4 = zip_entry_crc32(pzVar5);
    if (uVar4 != 0x845ecdfa) {
      pcVar10 = "CRC32DATA1 == zip_entry_crc32(zip)";
      uVar9 = 0x2e;
      goto LAB_0010259b;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar3 = zip_entry_close(pzVar5);
    if (iVar3 != 0) {
      uVar9 = 0x2f;
      goto LAB_0010269d;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar3 = zip_is64(pzVar5);
    if (iVar3 != 1) {
      pcVar8 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uVar9 = 0x31;
      pcVar10 = (char *)0x1;
      goto LAB_001026a3;
    }
    putchar(0x2e);
    zip_close(pzVar5);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001026b9;
  }
  else {
    uVar9 = 0x29;
LAB_0010269d:
    pcVar8 = "%s failed:\n\t%s:%d: %d expected but was %d";
    pcVar10 = (char *)0x0;
LAB_001026a3:
    snprintf(minunit_last_message,0x400,pcVar8,"test_write",
             "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
             uVar9,pcVar10);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001026b9:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    unlink(WFILE);
    unlink(ZIPNAME);
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    builtin_strncpy(ZIPNAME,"z-XXXXXX",9);
    ZIPNAME[9] = '\0';
    ZIPNAME[10] = '\0';
    ZIPNAME[0xb] = '\0';
    ZIPNAME[0xc] = '\0';
    ZIPNAME[0xd] = '\0';
    ZIPNAME[0xe] = '\0';
    ZIPNAME[0xf] = '\0';
    ZIPNAME[0x10] = '\0';
    ZIPNAME[0x11] = '\0';
    ZIPNAME[0x12] = '\0';
    ZIPNAME[0x13] = '\0';
    builtin_strncpy(WFILE,"w-XXXXXX",9);
    WFILE[9] = '\0';
    WFILE[10] = '\0';
    WFILE[0xb] = '\0';
    WFILE[0xc] = '\0';
    WFILE[0xd] = '\0';
    WFILE[0xe] = '\0';
    WFILE[0xf] = '\0';
    WFILE[0x10] = '\0';
    WFILE[0x11] = '\0';
    WFILE[0x12] = '\0';
    WFILE[0x13] = '\0';
    mkstemp(ZIPNAME);
    mkstemp(WFILE);
  }
  minunit_status = '\0';
  pzVar5 = zip_open(ZIPNAME,6,'w');
  minunit_assert = minunit_assert + 1;
  if (pzVar5 == (zip_t *)0x0) {
    pcVar10 = "zip != NULL";
    uVar9 = 0x38;
LAB_0010284d:
    pcVar8 = "%s failed:\n\t%s:%d: %s";
    goto LAB_00102955;
  }
  putchar(0x2e);
  minunit_assert = minunit_assert + 1;
  iVar3 = zip_entry_open(pzVar5,anon_var_dwarf_1b8);
  if (iVar3 == 0) {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar3 = zip_entry_write(pzVar5,"Some test data 1...",0x13);
    if (iVar3 != 0) {
      uVar9 = 0x3b;
      goto LAB_0010294f;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    pcVar10 = zip_entry_name(pzVar5);
    iVar3 = strcmp(pcVar10,anon_var_dwarf_1b8);
    if (iVar3 != 0) {
      uVar9 = 0x3d;
      goto LAB_0010294f;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    sVar6 = zip_entry_index(pzVar5);
    if ((int)sVar6 != 0) {
      uVar9 = 0x3e;
      goto LAB_0010294f;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    uVar7 = zip_entry_size(pzVar5);
    if ((int)uVar7 != 0x13) {
      pcVar8 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uVar9 = 0x3f;
      pcVar10 = (char *)0x13;
      goto LAB_00102955;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    uVar4 = zip_entry_crc32(pzVar5);
    if (uVar4 != 0x845ecdfa) {
      pcVar10 = "CRC32DATA1 == zip_entry_crc32(zip)";
      uVar9 = 0x40;
      goto LAB_0010284d;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar3 = zip_entry_close(pzVar5);
    if (iVar3 != 0) {
      uVar9 = 0x41;
      goto LAB_0010294f;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar3 = zip_is64(pzVar5);
    if (iVar3 != 1) {
      pcVar8 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uVar9 = 0x43;
      pcVar10 = (char *)0x1;
      goto LAB_00102955;
    }
    putchar(0x2e);
    zip_close(pzVar5);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_0010296b;
  }
  else {
    uVar9 = 0x3a;
LAB_0010294f:
    pcVar8 = "%s failed:\n\t%s:%d: %d expected but was %d";
    pcVar10 = (char *)0x0;
LAB_00102955:
    snprintf(minunit_last_message,0x400,pcVar8,"test_write_utf",
             "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
             uVar9,pcVar10);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_0010296b:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    unlink(WFILE);
    unlink(ZIPNAME);
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    builtin_strncpy(ZIPNAME,"z-XXXXXX",9);
    ZIPNAME[9] = '\0';
    ZIPNAME[10] = '\0';
    ZIPNAME[0xb] = '\0';
    ZIPNAME[0xc] = '\0';
    ZIPNAME[0xd] = '\0';
    ZIPNAME[0xe] = '\0';
    ZIPNAME[0xf] = '\0';
    ZIPNAME[0x10] = '\0';
    ZIPNAME[0x11] = '\0';
    ZIPNAME[0x12] = '\0';
    ZIPNAME[0x13] = '\0';
    builtin_strncpy(WFILE,"w-XXXXXX",9);
    WFILE[9] = '\0';
    WFILE[10] = '\0';
    WFILE[0xb] = '\0';
    WFILE[0xc] = '\0';
    WFILE[0xd] = '\0';
    WFILE[0xe] = '\0';
    WFILE[0xf] = '\0';
    WFILE[0x10] = '\0';
    WFILE[0x11] = '\0';
    WFILE[0x12] = '\0';
    WFILE[0x13] = '\0';
    mkstemp(ZIPNAME);
    mkstemp(WFILE);
  }
  minunit_status = '\0';
  __s = fopen(WFILE,"w+");
  if (__s == (FILE *)0x0) {
    minunit_assert = minunit_assert + 1;
    pcVar10 = "Cannot open filename\n";
    uVar9 = 0x53;
LAB_00102b04:
    pcVar8 = "%s failed:\n\t%s:%d: %s";
LAB_00102b08:
    snprintf(minunit_last_message,0x400,pcVar8,"test_fwrite",
             "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
             uVar9,pcVar10);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
  }
  else {
    fwrite("Some test data 1...",1,0x13,__s);
    minunit_assert = minunit_assert + 1;
    iVar3 = fclose(__s);
    if (iVar3 != 0) {
      uVar9 = 0x56;
      goto LAB_00102ac4;
    }
    putchar(0x2e);
    pzVar5 = zip_open(ZIPNAME,9,'w');
    minunit_assert = minunit_assert + 1;
    if (pzVar5 == (zip_t *)0x0) {
      pcVar10 = "zip != NULL";
      uVar9 = 0x59;
      goto LAB_00102b04;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar3 = zip_entry_open(pzVar5,WFILE);
    if (iVar3 != 0) {
      uVar9 = 0x5a;
LAB_00102ac4:
      pcVar8 = "%s failed:\n\t%s:%d: %d expected but was %d";
      pcVar10 = (char *)0x0;
      goto LAB_00102b08;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar3 = zip_entry_fwrite(pzVar5,WFILE);
    if (iVar3 != 0) {
      uVar9 = 0x5b;
      goto LAB_00102ac4;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar3 = zip_entry_close(pzVar5);
    if (iVar3 != 0) {
      uVar9 = 0x5c;
      goto LAB_00102ac4;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar3 = zip_is64(pzVar5);
    if (iVar3 != 1) {
      pcVar8 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uVar9 = 0x5d;
      pcVar10 = (char *)0x1;
      goto LAB_00102b08;
    }
    putchar(0x2e);
    zip_close(pzVar5);
    minunit_run = minunit_run + 1;
    if (minunit_status != '\x01') goto LAB_00102b43;
  }
  minunit_fail = minunit_fail + 1;
  putchar(0x46);
  printf("\n%s\n",minunit_last_message);
LAB_00102b43:
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    unlink(WFILE);
    unlink(ZIPNAME);
  }
  minunit_setup = (_func_void *)0x0;
  minunit_teardown = (_func_void *)0x0;
  printf("\n\n%d tests, %d assertions, %d failures\n",(ulong)(uint)minunit_run,
         (ulong)(uint)minunit_assert,(ulong)(uint)minunit_fail);
  dVar1 = mu_timer_real();
  dVar2 = mu_timer_cpu();
  printf("\nFinished in %.8f seconds (real) %.8f seconds (proc)\n\n",
         SUB84(dVar1 - minunit_real_timer,0),dVar2 - minunit_proc_timer);
  return minunit_fail;
}

Assistant:

MU_TEST_SUITE(test_write_suite) {
  MU_SUITE_CONFIGURE(&test_setup, &test_teardown);

  MU_RUN_TEST(test_write);
  MU_RUN_TEST(test_write_utf);
  MU_RUN_TEST(test_fwrite);
}